

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O1

Error asmjit::CodeHolder_evaluateExpression(CodeHolder *self,Expression *exp,uint64_t *out)

{
  Slot *pSVar1;
  Slot *pSVar2;
  bool bVar3;
  Error EVar4;
  ulong uVar5;
  byte bVar6;
  byte bVar7;
  uint64_t *extraout_RDX;
  ulong uVar8;
  Error unaff_EBP;
  long lVar9;
  bool bVar10;
  uint64_t value [2];
  uint64_t v;
  Expression *local_50;
  ulong local_48;
  ulong local_40;
  Expression *local_38;
  
  lVar9 = 1;
  bVar10 = false;
  local_50 = exp;
  do {
    switch(*(undefined1 *)((long)(self->_allocator)._slots + lVar9 + -0x48)) {
    case 0:
      local_38 = (Expression *)0x0;
      break;
    case 1:
      local_38 = (Expression *)(self->_allocator)._slots[lVar9 + -9];
      break;
    case 2:
      pSVar1 = (self->_allocator)._slots[lVar9 + -9];
      pSVar2 = pSVar1[4].next;
      if (pSVar2 != (Slot *)0x0) {
        local_38 = (Expression *)((long)&(pSVar2[2].next)->next + (long)&(pSVar1[3].next)->next);
        break;
      }
      EVar4 = 0x43;
LAB_00115c21:
      unaff_EBP = EVar4;
      bVar3 = false;
      goto LAB_00115c23;
    case 3:
      EVar4 = CodeHolder_evaluateExpression
                        ((CodeHolder *)(self->_allocator)._slots[lVar9 + -9],(Expression *)&local_38
                         ,out);
      out = extraout_RDX;
      if (EVar4 != 0) goto LAB_00115c21;
      break;
    default:
      bVar3 = false;
      unaff_EBP = 3;
      goto LAB_00115c23;
    }
    (&local_50)[lVar9] = local_38;
    bVar3 = true;
LAB_00115c23:
    if (!bVar3) break;
    lVar9 = lVar9 + 1;
    bVar10 = lVar9 != 2;
  } while (lVar9 == 2);
  if (!bVar10) {
    return unaff_EBP;
  }
  bVar6 = (byte)local_40;
  switch((self->_environment)._arch) {
  case '\0':
    uVar5 = local_40 + local_48;
    break;
  case '\x01':
    uVar5 = local_48 - local_40;
    break;
  case '\x02':
    uVar5 = local_40 * local_48;
    break;
  case '\x03':
    uVar8 = local_48 << (bVar6 & 0x3f);
    goto LAB_00115c95;
  case '\x04':
    uVar8 = local_48 >> (bVar6 & 0x3f);
LAB_00115c95:
    uVar5 = 0;
    if (local_40 < 0x40) {
      uVar5 = uVar8;
    }
    break;
  case '\x05':
    bVar7 = 0x3f;
    if (local_40 < 0x3f) {
      bVar7 = bVar6;
    }
    uVar5 = (long)local_48 >> (bVar7 & 0x3f);
    break;
  default:
    return 3;
  }
  local_50->opType = (char)uVar5;
  local_50->valueType[0] = (char)(uVar5 >> 8);
  local_50->valueType[1] = (char)(uVar5 >> 0x10);
  local_50->reserved[0] = (char)(uVar5 >> 0x18);
  local_50->reserved[1] = (char)(uVar5 >> 0x20);
  local_50->reserved[2] = (char)(uVar5 >> 0x28);
  local_50->reserved[3] = (char)(uVar5 >> 0x30);
  local_50->reserved[4] = (char)(uVar5 >> 0x38);
  return 0;
}

Assistant:

static Error CodeHolder_evaluateExpression(CodeHolder* self, Expression* exp, uint64_t* out) noexcept {
  uint64_t value[2];
  for (size_t i = 0; i < 2; i++) {
    uint64_t v;
    switch (exp->valueType[i]) {
      case Expression::kValueNone: {
        v = 0;
        break;
      }

      case Expression::kValueConstant: {
        v = exp->value[i].constant;
        break;
      }

      case Expression::kValueLabel: {
        LabelEntry* le = exp->value[i].label;
        if (!le->isBound())
          return DebugUtils::errored(kErrorExpressionLabelNotBound);
        v = le->section()->offset() + le->offset();
        break;
      }

      case Expression::kValueExpression: {
        Expression* nested = exp->value[i].expression;
        ASMJIT_PROPAGATE(CodeHolder_evaluateExpression(self, nested, &v));
        break;
      }

      default:
        return DebugUtils::errored(kErrorInvalidState);
    }

    value[i] = v;
  }

  uint64_t result;
  uint64_t& a = value[0];
  uint64_t& b = value[1];

  switch (exp->opType) {
    case Expression::kOpAdd:
      result = a + b;
      break;

    case Expression::kOpSub:
      result = a - b;
      break;

    case Expression::kOpMul:
      result = a * b;
      break;

    case Expression::kOpSll:
      result = (b > 63) ? uint64_t(0) : uint64_t(a << b);
      break;

    case Expression::kOpSrl:
      result = (b > 63) ? uint64_t(0) : uint64_t(a >> b);
      break;

    case Expression::kOpSra:
      result = Support::sar(a, Support::min<uint64_t>(b, 63));
      break;

    default:
      return DebugUtils::errored(kErrorInvalidState);
  }

  *out = result;
  return kErrorOk;
}